

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O0

bool __thiscall
bssl::FindEmailAddressesInName
          (bssl *this,Input name_rdn_sequence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *contained_email_addresses)

{
  Input lhs;
  Input input;
  bool bVar1;
  undefined1 local_108 [8];
  string email_address;
  Span<const_unsigned_char> local_d8;
  uchar *local_c8;
  size_t sStack_c0;
  reference local_b0;
  X509NameAttribute *type_and_value;
  iterator __end2;
  iterator __begin2;
  RelativeDistinguishedName *__range2;
  undefined1 local_80 [8];
  RelativeDistinguishedName type_and_values;
  Parser rdn_parser;
  undefined1 local_40 [8];
  Parser rdn_sequence_parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *contained_email_addresses_local;
  Input name_rdn_sequence_local;
  
  rdn_sequence_parser.advance_len_ = name_rdn_sequence.data_.size_;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)rdn_sequence_parser.advance_len_);
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_40,input);
  while( true ) {
    bVar1 = der::Parser::HasMore((Parser *)local_40);
    if (!bVar1) {
      name_rdn_sequence_local.data_.size_._7_1_ = 1;
      goto LAB_0061eac5;
    }
    der::Parser::Parser((Parser *)
                        &type_and_values.
                         super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = der::Parser::ReadConstructed
                      ((Parser *)local_40,0x20000011,
                       (Parser *)
                       &type_and_values.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::vector
              ((vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)local_80
              );
    bVar1 = ReadRdn((Parser *)
                    &type_and_values.
                     super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                    local_80);
    if (bVar1) {
      __end2 = ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
               begin((vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                     local_80);
      type_and_value =
           (X509NameAttribute *)
           ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::end
                     ((vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                      local_80);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
                                         *)&type_and_value), bVar1) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
                   ::operator*(&__end2);
        local_c8 = (local_b0->type).data_.data_;
        sStack_c0 = (local_b0->type).data_.size_;
        Span<unsigned_char_const>::Span<9ul>
                  ((Span<unsigned_char_const> *)(email_address.field_2._M_local_buf + 8),
                   (uchar (*) [9])kTypeEmailAddressOid);
        der::Input::Input((Input *)&local_d8,stack0xffffffffffffff18);
        lhs.data_.size_ = sStack_c0;
        lhs.data_.data_ = local_c8;
        bVar1 = der::operator==(lhs,(Input)local_d8);
        if (bVar1) {
          ::std::__cxx11::string::string((string *)local_108);
          bVar1 = X509NameAttribute::ValueAsString(local_b0,(string *)local_108);
          if (bVar1) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)rdn_sequence_parser.advance_len_,(value_type *)local_108);
          }
          else {
            name_rdn_sequence_local.data_.size_._7_1_ = 0;
          }
          bVar1 = !bVar1;
          ::std::__cxx11::string::~string((string *)local_108);
          if (bVar1) goto LAB_0061ea9a;
        }
        __gnu_cxx::
        __normal_iterator<bssl::X509NameAttribute_*,_std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>
        ::operator++(&__end2);
      }
      bVar1 = false;
    }
    else {
      name_rdn_sequence_local.data_.size_._7_1_ = 0;
      bVar1 = true;
    }
LAB_0061ea9a:
    ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::~vector
              ((vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)local_80
              );
    if (bVar1) {
LAB_0061eac5:
      return (bool)(name_rdn_sequence_local.data_.size_._7_1_ & 1);
    }
  }
  name_rdn_sequence_local.data_.size_._7_1_ = 0;
  goto LAB_0061eac5;
}

Assistant:

bool FindEmailAddressesInName(
    der::Input name_rdn_sequence,
    std::vector<std::string> *contained_email_addresses) {
  contained_email_addresses->clear();

  der::Parser rdn_sequence_parser(name_rdn_sequence);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }

    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      if (type_and_value.type == der::Input(kTypeEmailAddressOid)) {
        std::string email_address;
        if (!type_and_value.ValueAsString(&email_address)) {
          return false;
        }
        contained_email_addresses->push_back(std::move(email_address));
      }
    }
  }

  return true;
}